

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

v_array<COST_SENSITIVE::label> *
Search::read_allowed_transitions
          (v_array<COST_SENSITIVE::label> *__return_storage_ptr__,action A,char *filename)

{
  int iVar1;
  FILE *__stream;
  ostream *poVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  vw_exception *this;
  size_t to_1;
  ulong uVar6;
  bool *pbVar7;
  int iVar8;
  ulong uVar9;
  int to;
  int from;
  label ld;
  stringstream __msg;
  int local_228;
  int local_224;
  bool *local_220;
  v_array<COST_SENSITIVE::label> *local_218;
  int local_20c;
  char *local_208;
  ulong local_200;
  undefined8 local_1f8;
  wclass *pwStack_1f0;
  wclass *local_1e8;
  size_t sStack_1e0;
  string local_1d8;
  undefined1 local_1b8 [24];
  size_t sStack_1a0;
  
  local_218 = __return_storage_ptr__;
  local_208 = filename;
  __stream = fopen64(filename,"r");
  if (__stream != (FILE *)0x0) {
    uVar6 = (ulong)(A + 1);
    local_220 = calloc_or_throw<bool>(uVar6 * uVar6);
    iVar8 = 0;
    iVar1 = __isoc99_fscanf(__stream,"%d:%d",&local_224,&local_228);
    if (0 < iVar1) {
      iVar8 = 0;
      do {
        if (local_224 < 0 || (int)A < local_224) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"warning: ignoring transition from ",0x22);
          poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,local_224);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," because it\'s out of the range [0,",0x22);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
          std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
        }
        if (local_228 < 0 || (int)A < local_228) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"warning: ignoring transition to ",0x20);
          poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,local_228);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," because it\'s out of the range [0,",0x22);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
          std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
        }
        local_220[local_224 * (A + 1) + local_228] = true;
        iVar8 = iVar8 + 1;
        iVar1 = __isoc99_fscanf(__stream,"%d:%d",&local_224,&local_228);
      } while (0 < iVar1);
    }
    local_20c = iVar8;
    fclose(__stream);
    local_218->_begin = (label *)0x0;
    local_218->_end = (label *)0x0;
    local_218->end_array = (label *)0x0;
    local_218->erase_count = 0;
    if (A != 0) {
      uVar9 = 0;
      pbVar7 = local_220;
      local_200 = uVar6;
      do {
        local_1b8._16_8_ = (wclass *)0x0;
        sStack_1a0 = 0;
        local_1b8._0_8_ = (wclass *)0x0;
        local_1b8._8_8_ = (wclass *)0x0;
        uVar6 = 0;
        do {
          if (pbVar7[uVar6] == true) {
            local_1f8._4_4_ = (uint32_t)uVar6;
            local_1f8._0_4_ = 3.4028235e+38;
            pwStack_1f0 = (wclass *)0x0;
            v_array<COST_SENSITIVE::wclass>::push_back
                      ((v_array<COST_SENSITIVE::wclass> *)local_1b8,(wclass *)&local_1f8);
          }
          uVar6 = uVar6 + 1;
        } while (A != uVar6);
        local_1e8 = (wclass *)local_1b8._16_8_;
        sStack_1e0 = sStack_1a0;
        local_1f8 = (wclass *)local_1b8._0_8_;
        pwStack_1f0 = (wclass *)local_1b8._8_8_;
        v_array<COST_SENSITIVE::label>::push_back(local_218,(label *)&local_1f8);
        uVar9 = uVar9 + 1;
        pbVar7 = pbVar7 + local_200;
      } while (uVar9 != A);
    }
    free(local_220);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"read ",5);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,local_20c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," allowed transitions from ",0x1a);
    pcVar5 = local_208;
    if (local_208 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(local_208);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return local_218;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"error: could not read file ",0x1b);
  poVar2 = std::operator<<((ostream *)(local_1b8 + 0x10),local_208);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  poVar2 = std::operator<<(poVar2,pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"); assuming all transitions are valid",0x25);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
             ,0xa0d,&local_1d8);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

v_array<CS::label> read_allowed_transitions(action A, const char* filename)
{
  FILE* f = fopen(filename, "r");
  if (f == nullptr)
    THROW("error: could not read file " << filename << " (" << strerror(errno)
                                        << "); assuming all transitions are valid");

  bool* bg = calloc_or_throw<bool>(((size_t)(A + 1)) * (A + 1));
  int rd, from, to, count = 0;
  while ((rd = fscanf(f, "%d:%d", &from, &to)) > 0)
  {
    if ((from < 0) || (from > (int)A))
    {
      std::cerr << "warning: ignoring transition from " << from << " because it's out of the range [0," << A << "]"
                << endl;
    }
    if ((to < 0) || (to > (int)A))
    {
      std::cerr << "warning: ignoring transition to " << to << " because it's out of the range [0," << A << "]" << endl;
    }
    bg[from * (A + 1) + to] = true;
    count++;
  }
  fclose(f);

  v_array<CS::label> allowed = v_init<CS::label>();

  for (size_t from = 0; from < A; from++)
  {
    v_array<CS::wclass> costs = v_init<CS::wclass>();

    for (size_t to = 0; to < A; to++)
      if (bg[from * (A + 1) + to])
      {
        CS::wclass c = {FLT_MAX, (action)to, 0., 0.};
        costs.push_back(c);
      }

    CS::label ld = {costs};
    allowed.push_back(ld);
  }
  free(bg);

  std::cerr << "read " << count << " allowed transitions from " << filename << endl;

  return allowed;
}